

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_ascii_inv_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  uchar c;
  zueci_u32 *p_u_local;
  uint flags_local;
  zueci_u32 len_local;
  uchar *src_local;
  undefined4 local_4;
  
  bVar1 = *src;
  if ((((flags & 1) == 0) && (bVar1 != 0x7f)) &&
     (((0x7a < bVar1 || (((bVar1 == 0x23 || (bVar1 == 0x24)) || (bVar1 == 0x40)))) ||
      (((0x5a < bVar1 && (bVar1 != 0x5f)) && (bVar1 < 0x61)))))) {
    local_4 = 0;
  }
  else {
    *p_u = (uint)bVar1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int zueci_ascii_inv_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags,
            zueci_u32 *p_u) {
    const unsigned char c = *src;
    (void)len;
    if ((flags & ZUECI_FLAG_SB_STRAIGHT_THRU) || c == 0x7F || (c <= 'z' && c != '#' && c != '$' && c != '@'
            && (c <= 'Z' || c == '_' || c >= 'a'))) {
        *p_u = c;
        return 1;
    }
    return 0;
}